

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint32_t decoded;
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  uint64_t uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  uint64_t *puVar10;
  uint32_t *puVar11;
  ulong uVar12;
  ushort local_34;
  rfc7181_metric_field metric;
  
  BEGIN_TESTING((_func_void *)0x0);
  cunit_start_test("test_timetlv_decoding");
  puVar10 = _timetlv_table;
  for (uVar12 = 0; uVar12 != 0x100; uVar12 = uVar12 + 1) {
    uVar6 = rfc5497_timetlv_decode(uVar12 & 0xff);
    cunit_named_check(uVar6 == *puVar10,"test_timetlv_decoding",0x267,
                      "decode(%lu) != %lu (was %lu instead)",uVar12,*puVar10,uVar6);
    puVar10 = puVar10 + 1;
  }
  cunit_end_test("test_timetlv_decoding");
  cunit_start_test("test_timetlv_encoding_exact");
  for (uVar12 = 1; uVar12 != 0x100; uVar12 = uVar12 + 1) {
    uVar6 = _timetlv_table[uVar12];
    if (uVar6 != *(uint64_t *)("encode(%u)=%u, decode(%u-1)=%u, %u >= %u" + uVar12 * 8 + 0x22)) {
      bVar3 = rfc5497_timetlv_encode(uVar6);
      cunit_named_check(uVar12 == bVar3,"test_timetlv_encoding_exact",0x27b,"encode(%lu) != %lu",
                        uVar6,uVar12);
    }
  }
  cunit_end_test("test_timetlv_encoding_exact");
  cunit_start_test("test_timetlv_encoding_average");
  for (lVar7 = 1; lVar7 != 0x100; lVar7 = lVar7 + 1) {
    uVar12 = *(ulong *)("encode(%u)=%u, decode(%u-1)=%u, %u >= %u" + lVar7 * 8 + 0x22);
    uVar2 = _timetlv_table[lVar7];
    lVar8 = -1;
    if (1 < uVar2 - uVar12) {
      for (; lVar8 != -5; lVar8 = lVar8 + -1) {
        uVar9 = (ulong)(uint)((int)uVar2 + (int)lVar8);
        if (uVar12 < uVar9) {
          _do_timetlv_average_test(uVar9);
        }
      }
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        uVar9 = (ulong)(uint)((int)uVar12 + 1 + (int)lVar8);
        if (uVar9 < uVar2) {
          _do_timetlv_average_test(uVar9);
        }
      }
    }
  }
  cunit_end_test("test_timetlv_encoding_average");
  cunit_start_test("test_metric_decoding");
  puVar11 = _metric_table;
  for (uVar12 = 0; uVar12 != 0x1000; uVar12 = uVar12 + 1) {
    local_34 = (ushort)uVar12 << 8 | (ushort)uVar12 >> 8;
    uVar4 = rfc7181_metric_decode(&local_34);
    cunit_named_check(uVar4 == *puVar11,"test_metric_decoding",0x2c0,"decode(%u) != %u",
                      uVar12 & 0xffffffff,(ulong)uVar4);
    puVar11 = puVar11 + 1;
  }
  cunit_end_test("test_metric_decoding");
  cunit_start_test("test_metric_encoding_exact");
  puVar11 = _metric_table;
  for (uVar12 = 0; uVar12 != 0x1000; uVar12 = uVar12 + 1) {
    uVar4 = *puVar11;
    iVar5 = rfc7181_metric_encode(&metric,uVar4);
    cunit_named_check(iVar5 == 0,"test_metric_encoding_exact",0x2cf,"Metric encoding failed : %u",
                      (ulong)uVar4);
    cunit_named_check(uVar12 == (ushort)((short)metric.b << 8 | (ushort)metric.b >> 8),
                      "test_metric_encoding_exact",0x2d1,"encode(%u) != %u",(ulong)uVar4,
                      uVar12 & 0xffffffff);
    puVar11 = puVar11 + 1;
  }
  cunit_end_test("test_metric_encoding_exact");
  cunit_start_test("test_metric_encoding_average");
  for (lVar7 = 1; lVar7 != 0x1000; lVar7 = lVar7 + 1) {
    uVar4 = *(uint *)((long)_timetlv_table + lVar7 * 4 + 0x7fc);
    uVar1 = _metric_table[lVar7];
    if (1 < uVar1 - uVar4) {
      for (iVar5 = -1; iVar5 != -5; iVar5 = iVar5 + -1) {
        if (uVar4 < uVar1 + iVar5) {
          _do_metric_average_test(uVar1 + iVar5);
        }
      }
      for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
        decoded = uVar4 + 1 + iVar5;
        if (decoded < uVar1) {
          _do_metric_average_test(decoded);
        }
      }
    }
  }
  cunit_end_test("test_metric_encoding_average");
  iVar5 = FINISH_TESTING();
  return iVar5;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(NULL);

  test_timetlv_decoding();
  test_timetlv_encoding_exact();
  test_timetlv_encoding_average();

  test_metric_decoding();
  test_metric_encoding_exact();
  test_metric_encoding_average();

  return FINISH_TESTING();
}